

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O1

void lwsl_emit_stderr_notimestamp(int level,char *line)

{
  int iVar1;
  
  if (tty == '\0') {
    iVar1 = isatty(2);
    tty = (byte)iVar1 | 2;
  }
  if (tty == '\x03') {
    lwsl_emit_stderr_notimestamp_cold_1();
    return;
  }
  fputs(line,_stderr);
  return;
}

Assistant:

void
lwsl_emit_stderr_notimestamp(int level, const char *line)
{
	int n, m = LWS_ARRAY_SIZE(colours) - 1;

	if (!tty)
		tty = isatty(2) | 2;

	if (tty == 3) {
		n = 1 << (LWS_ARRAY_SIZE(colours) - 1);
		while (n) {
			if (level & n)
				break;
			m--;
			n >>= 1;
		}
		fprintf(stderr, "%c%s%s%c[0m", 27, colours[m], line, 27);
	} else
		fprintf(stderr, "%s", line);
}